

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_wait_closed(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  time_t start_time;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  do {
    pLVar1 = channel->session;
    if ((channel->remote).eof == '\0') {
      iVar2 = _libssh2_error(pLVar1,-0x22,
                             "libssh2_channel_wait_closed() invoked when channel is not in EOF state"
                            );
    }
    else {
      if (channel->wait_closed_state == libssh2_NB_state_idle) {
        channel->wait_closed_state = libssh2_NB_state_created;
      }
      if ((channel->remote).close == '\0') {
        do {
          iVar2 = _libssh2_transport_read(pLVar1);
          if ((channel->remote).close != '\0') break;
        } while (0 < iVar2);
        if (iVar2 < 0) goto LAB_0010cda1;
      }
      channel->wait_closed_state = libssh2_NB_state_idle;
      iVar2 = 0;
    }
LAB_0010cda1:
    if (iVar2 != -0x25) {
      return iVar2;
    }
    pLVar1 = channel->session;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar2 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int channel_wait_closed(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    int rc;

    if(!channel->remote.eof) {
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "libssh2_channel_wait_closed() invoked when "
                              "channel is not in EOF state");
    }

    if(channel->wait_closed_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Awaiting close of channel %u/%u", channel->local.id,
                       channel->remote.id));

        channel->wait_closed_state = libssh2_NB_state_created;
    }

    /*
     * While channel is not closed, read more packets from the network.
     * Either the channel will be closed or network timeout will occur.
     */
    if(!channel->remote.close) {
        do {
            rc = _libssh2_transport_read(session);
            if(channel->remote.close)
                /* it is now closed, move on! */
                break;
        } while(rc > 0);
        if(rc < 0)
            return rc;
    }

    channel->wait_closed_state = libssh2_NB_state_idle;

    return 0;
}